

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options,bool immutable_api)

{
  int iVar1;
  int iVar2;
  ClassNameResolver *pCVar3;
  pointer pGVar4;
  Descriptor *pDVar5;
  reference this_00;
  FieldDescriptor *pFVar6;
  undefined4 extraout_var;
  byte in_CL;
  FileDescriptor *in_RSI;
  undefined8 *in_RDI;
  int i_1;
  int i;
  Context *in_stack_fffffffffffffeb8;
  ImmutableGeneratorFactory *in_stack_fffffffffffffec0;
  allocator_type *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  Options *in_stack_fffffffffffffee0;
  Options *in_stack_fffffffffffffef0;
  FileDescriptor *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  FileDescriptor *in_stack_ffffffffffffff08;
  undefined1 immutable;
  string *this_01;
  FileDescriptor *in_stack_ffffffffffffff10;
  ClassNameResolver *in_stack_ffffffffffffff18;
  int local_58;
  int local_54;
  string local_50 [55];
  byte local_19;
  FileDescriptor *local_10;
  
  local_19 = in_CL & 1;
  *in_RDI = in_RSI;
  local_10 = in_RSI;
  FileJavaPackage_abi_cxx11_
            (in_stack_ffffffffffffff08,SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0));
  immutable = (undefined1)((ulong)in_stack_ffffffffffffff08 >> 0x38);
  std::__cxx11::string::string((string *)(in_RDI + 5));
  FileDescriptor::message_type_count(local_10);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
  ::allocator((allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
               *)0x52fe32);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
  ::vector((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
            *)in_stack_fffffffffffffee0,
           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
           (allocator_type *)in_stack_fffffffffffffed0);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
  ::~allocator((allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>
                *)0x52fe5e);
  FileDescriptor::extension_count(local_10);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
  ::allocator((allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
               *)0x52feae);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
  ::vector((vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
            *)in_stack_fffffffffffffee0,
           CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),in_stack_fffffffffffffed0);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
  ::~allocator((allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>
                *)0x52feda);
  std::
  unique_ptr<google::protobuf::compiler::java::GeneratorFactory,std::default_delete<google::protobuf::compiler::java::GeneratorFactory>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::GeneratorFactory>,void>
            ((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
              *)in_stack_fffffffffffffec0);
  operator_new(0xb0);
  Context::Context((Context *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::
  unique_ptr<google::protobuf::compiler::java::Context,std::default_delete<google::protobuf::compiler::java::Context>>
  ::unique_ptr<std::default_delete<google::protobuf::compiler::java::Context>,void>
            ((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
              *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::
  unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
  ::operator->((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
                *)0x52ff6e);
  pCVar3 = Context::GetNameResolver((Context *)0x52ff76);
  in_RDI[0x11] = pCVar3;
  Options::Options(in_stack_fffffffffffffee0,
                   (Options *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  *(byte *)(in_RDI + 0x1b) = local_19 & 1;
  ClassNameResolver::GetFileClassName_abi_cxx11_
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(bool)immutable);
  this_01 = local_50;
  std::__cxx11::string::operator=((string *)(in_RDI + 5),this_01);
  std::__cxx11::string::~string(this_01);
  operator_new(0x10);
  std::
  unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
  ::get((unique_ptr<google::protobuf::compiler::java::Context,_std::default_delete<google::protobuf::compiler::java::Context>_>
         *)in_stack_fffffffffffffec0);
  ImmutableGeneratorFactory::ImmutableGeneratorFactory
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  std::
  unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
  ::reset((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
           *)in_stack_fffffffffffffec0,(pointer)in_stack_fffffffffffffeb8);
  local_54 = 0;
  while( true ) {
    iVar2 = local_54;
    iVar1 = FileDescriptor::message_type_count((FileDescriptor *)*in_RDI);
    if (iVar1 <= iVar2) break;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
    ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>_>_>
                  *)(in_RDI + 9),(long)local_54);
    pGVar4 = std::
             unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                           *)0x5300d2);
    pDVar5 = FileDescriptor::message_type((FileDescriptor *)*in_RDI,local_54);
    (*pGVar4->_vptr_GeneratorFactory[2])(pGVar4,pDVar5);
    std::
    unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
    ::reset((unique_ptr<google::protobuf::compiler::java::MessageGenerator,_std::default_delete<google::protobuf::compiler::java::MessageGenerator>_>
             *)in_stack_fffffffffffffec0,(pointer)in_stack_fffffffffffffeb8);
    local_54 = local_54 + 1;
  }
  local_58 = 0;
  while( true ) {
    iVar2 = local_58;
    iVar1 = FileDescriptor::extension_count((FileDescriptor *)*in_RDI);
    if (iVar1 <= iVar2) break;
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
              ::operator[]((vector<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>_>_>
                            *)(in_RDI + 0xc),(long)local_58);
    pGVar4 = std::
             unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
             ::operator->((unique_ptr<google::protobuf::compiler::java::GeneratorFactory,_std::default_delete<google::protobuf::compiler::java::GeneratorFactory>_>
                           *)0x5302b4);
    pFVar6 = FileDescriptor::extension((FileDescriptor *)*in_RDI,local_58);
    iVar2 = (*pGVar4->_vptr_GeneratorFactory[3])(pGVar4,pFVar6);
    std::
    unique_ptr<google::protobuf::compiler::java::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::java::ExtensionGenerator>_>
    ::reset(this_00,(pointer)CONCAT44(extraout_var,iVar2));
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options,
                             bool immutable_api)
    : file_(file),
      java_package_(FileJavaPackage(file, immutable_api)),
      message_generators_(file->message_type_count()),
      extension_generators_(file->extension_count()),
      context_(new Context(file, options)),
      name_resolver_(context_->GetNameResolver()),
      options_(options),
      immutable_api_(immutable_api) {
  classname_ = name_resolver_->GetFileClassName(file, immutable_api);
  generator_factory_.reset(new ImmutableGeneratorFactory(context_.get()));
  for (int i = 0; i < file_->message_type_count(); ++i) {
    message_generators_[i].reset(
        generator_factory_->NewMessageGenerator(file_->message_type(i)));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    extension_generators_[i].reset(
        generator_factory_->NewExtensionGenerator(file_->extension(i)));
  }
}